

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nonlinearsolver.c
# Opt level: O0

SUNErrCode SUNNonlinSolFree(SUNNonlinearSolver NLS)

{
  long *in_RDI;
  SUNErrCode local_4;
  
  if (in_RDI == (long *)0x0) {
    local_4 = 0;
  }
  else if ((in_RDI[1] == 0) || (*(long *)(in_RDI[1] + 0x20) == 0)) {
    if (*in_RDI != 0) {
      free((void *)*in_RDI);
      *in_RDI = 0;
    }
    if (in_RDI[1] != 0) {
      free((void *)in_RDI[1]);
      in_RDI[1] = 0;
    }
    free(in_RDI);
    local_4 = 0;
  }
  else {
    local_4 = (**(code **)(in_RDI[1] + 0x20))(in_RDI);
  }
  return local_4;
}

Assistant:

SUNErrCode SUNNonlinSolFree(SUNNonlinearSolver NLS)
{
  if (NLS == NULL) { return (SUN_SUCCESS); }

  /* if the free operation exists use it */
  if (NLS->ops)
  {
    if (NLS->ops->free) { return (NLS->ops->free(NLS)); }
  }

  /* if we reach this point, either ops == NULL or free == NULL,
     try to cleanup by freeing the content, ops, and solver */
  if (NLS->content)
  {
    free(NLS->content);
    NLS->content = NULL;
  }
  if (NLS->ops)
  {
    free(NLS->ops);
    NLS->ops = NULL;
  }
  free(NLS);
  NLS = NULL;

  return (SUN_SUCCESS);
}